

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

char * uv_err_name(int err)

{
  char *pcStack_10;
  int err_local;
  
  if (err == -0xfff) {
    pcStack_10 = "EOF";
  }
  else if (err == -0xffe) {
    pcStack_10 = "UNKNOWN";
  }
  else if (err == -0xff0) {
    pcStack_10 = "ECHARSET";
  }
  else if (err == -0xfbc) {
    pcStack_10 = "EFTYPE";
  }
  else if (err == -0xbc6) {
    pcStack_10 = "EAI_PROTOCOL";
  }
  else if (err == -0xbc5) {
    pcStack_10 = "EAI_BADHINTS";
  }
  else if (err == -0xbc3) {
    pcStack_10 = "EAI_SOCKTYPE";
  }
  else if (err == -0xbc2) {
    pcStack_10 = "EAI_SERVICE";
  }
  else if (err == -0xbc1) {
    pcStack_10 = "EAI_OVERFLOW";
  }
  else if (err == -0xbc0) {
    pcStack_10 = "EAI_NONAME";
  }
  else if (err == -0xbbf) {
    pcStack_10 = "EAI_NODATA";
  }
  else if (err == -0xbbe) {
    pcStack_10 = "EAI_MEMORY";
  }
  else if (err == -0xbbd) {
    pcStack_10 = "EAI_FAMILY";
  }
  else if (err == -0xbbc) {
    pcStack_10 = "EAI_FAIL";
  }
  else if (err == -0xbbb) {
    pcStack_10 = "EAI_CANCELED";
  }
  else if (err == -0xbba) {
    pcStack_10 = "EAI_BADFLAGS";
  }
  else if (err == -0xbb9) {
    pcStack_10 = "EAI_AGAIN";
  }
  else if (err == -3000) {
    pcStack_10 = "EAI_ADDRFAMILY";
  }
  else if (err == -0x7d) {
    pcStack_10 = "ECANCELED";
  }
  else if (err == -0x79) {
    pcStack_10 = "EREMOTEIO";
  }
  else if (err == -0x72) {
    pcStack_10 = "EALREADY";
  }
  else if (err == -0x71) {
    pcStack_10 = "EHOSTUNREACH";
  }
  else if (err == -0x70) {
    pcStack_10 = "EHOSTDOWN";
  }
  else if (err == -0x6f) {
    pcStack_10 = "ECONNREFUSED";
  }
  else if (err == -0x6e) {
    pcStack_10 = "ETIMEDOUT";
  }
  else if (err == -0x6c) {
    pcStack_10 = "ESHUTDOWN";
  }
  else if (err == -0x6b) {
    pcStack_10 = "ENOTCONN";
  }
  else if (err == -0x6a) {
    pcStack_10 = "EISCONN";
  }
  else if (err == -0x69) {
    pcStack_10 = "ENOBUFS";
  }
  else if (err == -0x68) {
    pcStack_10 = "ECONNRESET";
  }
  else if (err == -0x67) {
    pcStack_10 = "ECONNABORTED";
  }
  else if (err == -0x65) {
    pcStack_10 = "ENETUNREACH";
  }
  else if (err == -100) {
    pcStack_10 = "ENETDOWN";
  }
  else if (err == -99) {
    pcStack_10 = "EADDRNOTAVAIL";
  }
  else if (err == -0x62) {
    pcStack_10 = "EADDRINUSE";
  }
  else if (err == -0x61) {
    pcStack_10 = "EAFNOSUPPORT";
  }
  else if (err == -0x5f) {
    pcStack_10 = "ENOTSUP";
  }
  else if (err == -0x5e) {
    pcStack_10 = "ESOCKTNOSUPPORT";
  }
  else if (err == -0x5d) {
    pcStack_10 = "EPROTONOSUPPORT";
  }
  else if (err == -0x5c) {
    pcStack_10 = "ENOPROTOOPT";
  }
  else if (err == -0x5b) {
    pcStack_10 = "EPROTOTYPE";
  }
  else if (err == -0x5a) {
    pcStack_10 = "EMSGSIZE";
  }
  else if (err == -0x59) {
    pcStack_10 = "EDESTADDRREQ";
  }
  else if (err == -0x58) {
    pcStack_10 = "ENOTSOCK";
  }
  else if (err == -0x54) {
    pcStack_10 = "EILSEQ";
  }
  else if (err == -0x4b) {
    pcStack_10 = "EOVERFLOW";
  }
  else if (err == -0x47) {
    pcStack_10 = "EPROTO";
  }
  else if (err == -0x40) {
    pcStack_10 = "ENONET";
  }
  else if (err == -0x28) {
    pcStack_10 = "ELOOP";
  }
  else if (err == -0x27) {
    pcStack_10 = "ENOTEMPTY";
  }
  else if (err == -0x26) {
    pcStack_10 = "ENOSYS";
  }
  else if (err == -0x24) {
    pcStack_10 = "ENAMETOOLONG";
  }
  else if (err == -0x22) {
    pcStack_10 = "ERANGE";
  }
  else if (err == -0x20) {
    pcStack_10 = "EPIPE";
  }
  else if (err == -0x1f) {
    pcStack_10 = "EMLINK";
  }
  else if (err == -0x1e) {
    pcStack_10 = "EROFS";
  }
  else if (err == -0x1d) {
    pcStack_10 = "ESPIPE";
  }
  else if (err == -0x1c) {
    pcStack_10 = "ENOSPC";
  }
  else if (err == -0x1b) {
    pcStack_10 = "EFBIG";
  }
  else if (err == -0x1a) {
    pcStack_10 = "ETXTBSY";
  }
  else if (err == -0x19) {
    pcStack_10 = "ENOTTY";
  }
  else if (err == -0x18) {
    pcStack_10 = "EMFILE";
  }
  else if (err == -0x17) {
    pcStack_10 = "ENFILE";
  }
  else if (err == -0x16) {
    pcStack_10 = "EINVAL";
  }
  else if (err == -0x15) {
    pcStack_10 = "EISDIR";
  }
  else if (err == -0x14) {
    pcStack_10 = "ENOTDIR";
  }
  else if (err == -0x13) {
    pcStack_10 = "ENODEV";
  }
  else if (err == -0x12) {
    pcStack_10 = "EXDEV";
  }
  else if (err == -0x11) {
    pcStack_10 = "EEXIST";
  }
  else if (err == -0x10) {
    pcStack_10 = "EBUSY";
  }
  else if (err == -0xe) {
    pcStack_10 = "EFAULT";
  }
  else if (err == -0xd) {
    pcStack_10 = "EACCES";
  }
  else if (err == -0xc) {
    pcStack_10 = "ENOMEM";
  }
  else if (err == -0xb) {
    pcStack_10 = "EAGAIN";
  }
  else if (err == -9) {
    pcStack_10 = "EBADF";
  }
  else if (err == -7) {
    pcStack_10 = "E2BIG";
  }
  else if (err == -6) {
    pcStack_10 = "ENXIO";
  }
  else if (err == -5) {
    pcStack_10 = "EIO";
  }
  else if (err == -4) {
    pcStack_10 = "EINTR";
  }
  else if (err == -3) {
    pcStack_10 = "ESRCH";
  }
  else if (err == -2) {
    pcStack_10 = "ENOENT";
  }
  else if (err == -1) {
    pcStack_10 = "EPERM";
  }
  else {
    pcStack_10 = uv__unknown_err_code(err);
  }
  return pcStack_10;
}

Assistant:

const char* uv_err_name(int err) {
  switch (err) {
    UV_ERRNO_MAP(UV_ERR_NAME_GEN)
  }
  return uv__unknown_err_code(err);
}